

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O2

unique_ptr<Catch::TeamCityReporter> __thiscall
Catch::Detail::make_unique<Catch::TeamCityReporter,Catch::ReporterConfig_const&>
          (Detail *this,ReporterConfig *args)

{
  TeamCityReporter *this_00;
  
  this_00 = (TeamCityReporter *)operator_new(0xc0);
  TeamCityReporter::TeamCityReporter(this_00,args);
  *(TeamCityReporter **)this = this_00;
  return (unique_ptr<Catch::TeamCityReporter>)(TeamCityReporter *)this;
}

Assistant:

unique_ptr<T> make_unique(Args&&... args) {
        // static_cast<Args&&> does the same thing as std::forward in
        // this case, but does not require including big header (<utility>)
        // and compiles faster thanks to not requiring template instantiation
        // and overload resolution
        return unique_ptr<T>(new T(static_cast<Args&&>(args)...));
    }